

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O1

bool __thiscall google::protobuf::io::CodedOutputStream::HadError(CodedOutputStream *this)

{
  LogMessage *pLVar1;
  uint8 *puVar2;
  LogMessage local_60 [63];
  LogFinisher local_21;
  
  puVar2 = (uint8 *)google::protobuf::io::EpsCopyOutputStream::FlushAndResetBuffer((uchar *)this);
  this->cur_ = puVar2;
  if (puVar2 == (uint8 *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/io/coded_stream.h"
               ,0x426);
    pLVar1 = (LogMessage *)
             google::protobuf::internal::LogMessage::operator<<(local_60,"CHECK failed: cur_: ");
    google::protobuf::internal::LogFinisher::operator=(&local_21,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(local_60);
  }
  return (bool)this->field_0x38;
}

Assistant:

bool HadError() {
    cur_ = impl_.FlushAndResetBuffer(cur_);
    GOOGLE_DCHECK(cur_);
    return impl_.HadError();
  }